

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOutputConverter.cxx
# Opt level: O1

string * cmOutputConverter::EscapeForCMake(string *__return_storage_ptr__,string *str)

{
  byte bVar1;
  byte *pbVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"\"","");
  pbVar2 = (byte *)(str->_M_dataplus)._M_p;
  do {
    bVar1 = *pbVar2;
    if (bVar1 < 0x24) {
      if (bVar1 != 0x22) {
        if (bVar1 == 0) {
          std::__cxx11::string::append((char *)__return_storage_ptr__);
          return __return_storage_ptr__;
        }
        goto LAB_00263d80;
      }
LAB_00263d72:
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    else {
      if ((bVar1 == 0x24) || (bVar1 == 0x5c)) goto LAB_00263d72;
LAB_00263d80:
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
    }
    pbVar2 = pbVar2 + 1;
  } while( true );
}

Assistant:

std::string cmOutputConverter::EscapeForCMake(const std::string& str)
{
  // Always double-quote the argument to take care of most escapes.
  std::string result = "\"";
  for(const char* c = str.c_str(); *c; ++c)
    {
    if(*c == '"')
      {
      // Escape the double quote to avoid ending the argument.
      result += "\\\"";
      }
    else if(*c == '$')
      {
      // Escape the dollar to avoid expanding variables.
      result += "\\$";
      }
    else if(*c == '\\')
      {
      // Escape the backslash to avoid other escapes.
      result += "\\\\";
      }
    else
      {
      // Other characters will be parsed correctly.
      result += *c;
      }
    }
  result += "\"";
  return result;
}